

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinImporter::ReadBinaryAnim(AssbinImporter *this,IOStream *stream,aiAnimation *anim)

{
  double dVar1;
  uint uVar2;
  aiNodeAnim **ppaVar3;
  aiNodeAnim *paVar4;
  runtime_error *this_00;
  ulong uVar5;
  ai_uint32 local_438;
  
  uVar2 = Read<unsigned_int>(stream);
  if (uVar2 == 0x123b) {
    Read<unsigned_int>(stream);
    Read<aiString>((aiString *)&stack0xfffffffffffffbc8,stream);
    if ((aiAnimation *)&stack0xfffffffffffffbc8 != anim) {
      (anim->mName).length = local_438;
      memcpy((anim->mName).data,&stack0xfffffffffffffbcc,(ulong)_local_438 & 0xffffffff);
      (anim->mName).data[(ulong)_local_438 & 0xffffffff] = '\0';
    }
    dVar1 = Read<double>(stream);
    anim->mDuration = dVar1;
    dVar1 = Read<double>(stream);
    anim->mTicksPerSecond = dVar1;
    uVar2 = Read<unsigned_int>(stream);
    anim->mNumChannels = uVar2;
    if (uVar2 != 0) {
      ppaVar3 = (aiNodeAnim **)operator_new__((ulong)uVar2 << 3);
      anim->mChannels = ppaVar3;
      if (anim->mNumChannels != 0) {
        uVar5 = 0;
        do {
          paVar4 = (aiNodeAnim *)operator_new(0x438);
          (paVar4->mNodeName).length = 0;
          (paVar4->mNodeName).data[0] = '\0';
          memset((paVar4->mNodeName).data + 1,0x1b,0x3ff);
          paVar4->mRotationKeys = (aiQuatKey *)0x0;
          paVar4->mNumScalingKeys = 0;
          *(undefined8 *)&paVar4->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar4->mPositionKeys + 4) = 0;
          paVar4->mScalingKeys = (aiVectorKey *)0x0;
          paVar4->mPreState = aiAnimBehaviour_DEFAULT;
          paVar4->mPostState = aiAnimBehaviour_DEFAULT;
          anim->mChannels[uVar5] = paVar4;
          ReadBinaryNodeAnim(this,stream,anim->mChannels[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar5 < anim->mNumChannels);
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  _local_438 = &stack0xfffffffffffffbd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffbc8,"Magic chunk identifiers are wrong!","");
  std::runtime_error::runtime_error(this_00,(string *)&stack0xfffffffffffffbc8);
  *(undefined ***)this_00 = &PTR__runtime_error_00900168;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryAnim( IOStream * stream, aiAnimation* anim ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIANIMATION)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    anim->mName = Read<aiString> (stream);
    anim->mDuration = Read<double> (stream);
    anim->mTicksPerSecond = Read<double> (stream);
    anim->mNumChannels = Read<unsigned int>(stream);

    if (anim->mNumChannels) {
        anim->mChannels = new aiNodeAnim*[ anim->mNumChannels ];
        for (unsigned int a = 0; a < anim->mNumChannels;++a) {
            anim->mChannels[a] = new aiNodeAnim();
            ReadBinaryNodeAnim(stream,anim->mChannels[a]);
        }
    }
}